

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O0

CURLcode glob_set(URLGlob *glob,char **patternp,size_t *posp,curl_off_t *amount,int globindex)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  URLPattern *pUVar6;
  char **ppcVar7;
  char *pcVar8;
  char **new_arr;
  size_t opos;
  char *opattern;
  char *pattern;
  char *buf;
  _Bool done;
  URLPattern *pat;
  int globindex_local;
  curl_off_t *amount_local;
  size_t *posp_local;
  char **patternp_local;
  URLGlob *glob_local;
  
  bVar4 = false;
  pattern = glob->glob_buffer;
  pcVar2 = *patternp;
  sVar3 = *posp;
  pUVar6 = glob->pattern + glob->size;
  pUVar6->type = UPTSet;
  (pUVar6->content).Set.size = 0;
  (pUVar6->content).Set.ptr_s = 0;
  (pUVar6->content).Set.elements = (char **)0x0;
  pUVar6->globindex = globindex;
  opattern = pcVar2;
  do {
    while( true ) {
      if (bVar4) {
        *patternp = opattern;
        return CURLE_OK;
      }
      cVar1 = *opattern;
      if (cVar1 == '\0') {
        glob->error = "unmatched brace";
        glob->pos = sVar3 - 1;
        return CURLE_URL_MALFORMAT;
      }
      if (cVar1 == ',') break;
      if (cVar1 == '[') {
LAB_00125e15:
        glob->error = "nested brace";
        glob->pos = *posp;
        return CURLE_URL_MALFORMAT;
      }
      if (cVar1 == '\\') {
        if (opattern[1] != '\0') {
          opattern = opattern + 1;
          *posp = *posp + 1;
        }
      }
      else {
        if (cVar1 == ']') {
          glob->error = "unexpected close bracket";
          glob->pos = *posp;
          return CURLE_URL_MALFORMAT;
        }
        if (cVar1 == '{') goto LAB_00125e15;
        if (cVar1 == '}') {
          if (pcVar2 == opattern) {
            glob->error = "empty string within braces";
            glob->pos = *posp;
            return CURLE_URL_MALFORMAT;
          }
          iVar5 = multiply(amount,(pUVar6->content).Set.size + 1);
          if (iVar5 != 0) {
            glob->error = "range overflow";
            glob->pos = 0;
            return CURLE_URL_MALFORMAT;
          }
          break;
        }
      }
      *pattern = *opattern;
      *posp = *posp + 1;
      pattern = pattern + 1;
LAB_001260d7:
      opattern = opattern + 1;
    }
    *pattern = '\0';
    if ((pUVar6->content).Set.elements == (char **)0x0) {
      ppcVar7 = (char **)malloc(8);
      (pUVar6->content).Set.elements = ppcVar7;
    }
    else {
      ppcVar7 = (char **)realloc((pUVar6->content).Set.elements,((pUVar6->content).Set.size + 1) * 8
                                );
      if (ppcVar7 == (char **)0x0) {
        glob->error = "out of memory";
        glob->pos = 0;
        return CURLE_OUT_OF_MEMORY;
      }
      (pUVar6->content).Set.elements = ppcVar7;
    }
    if ((pUVar6->content).Set.elements == (char **)0x0) {
      glob->error = "out of memory";
      glob->pos = 0;
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar8 = strdup(glob->glob_buffer);
    (pUVar6->content).Set.elements[(pUVar6->content).Set.size] = pcVar8;
    if ((pUVar6->content).Set.elements[(pUVar6->content).Set.size] == (char *)0x0) {
      glob->error = "out of memory";
      glob->pos = 0;
      return CURLE_OUT_OF_MEMORY;
    }
    (pUVar6->content).Set.size = (pUVar6->content).Set.size + 1;
    if (*opattern != '}') {
      pattern = glob->glob_buffer;
      *posp = *posp + 1;
      goto LAB_001260d7;
    }
    opattern = opattern + 1;
    bVar4 = true;
  } while( true );
}

Assistant:

static CURLcode glob_set(struct URLGlob *glob, char **patternp,
                         size_t *posp, curl_off_t *amount,
                         int globindex)
{
  /* processes a set expression with the point behind the opening '{'
     ','-separated elements are collected until the next closing '}'
  */
  struct URLPattern *pat;
  bool done = FALSE;
  char *buf = glob->glob_buffer;
  char *pattern = *patternp;
  char *opattern = pattern;
  size_t opos = *posp-1;

  pat = &glob->pattern[glob->size];
  /* patterns 0,1,2,... correspond to size=1,3,5,... */
  pat->type = UPTSet;
  pat->content.Set.size = 0;
  pat->content.Set.ptr_s = 0;
  pat->content.Set.elements = NULL;
  pat->globindex = globindex;

  while(!done) {
    switch(*pattern) {
    case '\0':                  /* URL ended while set was still open */
      return GLOBERROR("unmatched brace", opos, CURLE_URL_MALFORMAT);

    case '{':
    case '[':                   /* no nested expressions at this time */
      return GLOBERROR("nested brace", *posp, CURLE_URL_MALFORMAT);

    case '}':                           /* set element completed */
      if(opattern == pattern)
        return GLOBERROR("empty string within braces", *posp,
                         CURLE_URL_MALFORMAT);

      /* add 1 to size since it will be incremented below */
      if(multiply(amount, pat->content.Set.size + 1))
        return GLOBERROR("range overflow", 0, CURLE_URL_MALFORMAT);

      FALLTHROUGH();
    case ',':

      *buf = '\0';
      if(pat->content.Set.elements) {
        char **new_arr = realloc(pat->content.Set.elements,
                                 (size_t)(pat->content.Set.size + 1) *
                                 sizeof(char *));
        if(!new_arr)
          return GLOBERROR("out of memory", 0, CURLE_OUT_OF_MEMORY);

        pat->content.Set.elements = new_arr;
      }
      else
        pat->content.Set.elements = malloc(sizeof(char *));

      if(!pat->content.Set.elements)
        return GLOBERROR("out of memory", 0, CURLE_OUT_OF_MEMORY);

      pat->content.Set.elements[pat->content.Set.size] =
        strdup(glob->glob_buffer);
      if(!pat->content.Set.elements[pat->content.Set.size])
        return GLOBERROR("out of memory", 0, CURLE_OUT_OF_MEMORY);
      ++pat->content.Set.size;

      if(*pattern == '}') {
        pattern++; /* pass the closing brace */
        done = TRUE;
        continue;
      }

      buf = glob->glob_buffer;
      ++pattern;
      ++(*posp);
      break;

    case ']':                           /* illegal closing bracket */
      return GLOBERROR("unexpected close bracket", *posp, CURLE_URL_MALFORMAT);

    case '\\':                          /* escaped character, skip '\' */
      if(pattern[1]) {
        ++pattern;
        ++(*posp);
      }
      FALLTHROUGH();
    default:
      *buf++ = *pattern++;              /* copy character to set element */
      ++(*posp);
    }
  }

  *patternp = pattern; /* return with the new position */
  return CURLE_OK;
}